

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.cpp
# Opt level: O3

void luaT_init(lua_State *L)

{
  byte *pbVar1;
  TString *pTVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    pTVar2 = luaS_new(L,(char *)((long)&_ZZ9luaT_initP9lua_StateE14luaT_eventname_rel +
                                (long)*(int *)((long)&_ZZ9luaT_initP9lua_StateE14luaT_eventname_rel
                                              + lVar3)));
    *(TString **)((long)L->l_G->tmname + lVar3 * 2) = pTVar2;
    pbVar1 = (byte *)(*(long *)((long)L->l_G->tmname + lVar3 * 2) + 9);
    *pbVar1 = *pbVar1 | 0x20;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x44);
  return;
}

Assistant:

void luaT_init (lua_State *L) {
  static const char *const luaT_eventname[] = {  /* ORDER TM */
    "__index", "__newindex",
    "__gc", "__mode", "__len", "__eq",
    "__add", "__sub", "__mul", "__div", "__mod",
    "__pow", "__unm", "__lt", "__le",
    "__concat", "__call"
  };
  int i;
  for (i=0; i<TM_N; i++) {
    G(L)->tmname[i] = luaS_new(L, luaT_eventname[i]);
    luaS_fix(G(L)->tmname[i]);  /* never collect these names */
  }
}